

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

Comment * soul::SourceCodeUtilities::parseComment(Comment *__return_storage_ptr__,CodeLocation *pos)

{
  UTF8Reader *this;
  char *pcVar1;
  size_type sVar2;
  pointer pbVar3;
  bool bVar4;
  UnicodeChar UVar5;
  iterator __begin3;
  pointer pbVar6;
  size_t i;
  string *psVar7;
  iterator __begin4;
  ulong uVar8;
  const_iterator cVar9;
  undefined1 in_R8B;
  long lVar10;
  ulong uVar11;
  long lVar12;
  string *psVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string_view text;
  string_view s;
  string_view t;
  string line;
  Comment result;
  UTF8Reader closeComment;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar4 = CodeLocation::isEmpty(pos);
  if (bVar4) {
    __return_storage_ptr__->valid = false;
    __return_storage_ptr__->isStarSlash = false;
    __return_storage_ptr__->isDoxygenStyle = false;
    __return_storage_ptr__->isReferringBackwards = false;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->range).start.sourceCode.object = (SourceCodeText *)0x0;
    (__return_storage_ptr__->range).start.location.data = (char *)0x0;
    (__return_storage_ptr__->range).end.sourceCode.object = (SourceCodeText *)0x0;
    (__return_storage_ptr__->range).end.location.data = (char *)0x0;
    return __return_storage_ptr__;
  }
  result.valid = false;
  result.isStarSlash = false;
  result.isDoxygenStyle = false;
  result.isReferringBackwards = false;
  result.lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.range.start.sourceCode.object = (SourceCodeText *)0x0;
  result.range.start.location.data = (char *)0x0;
  result.range.end.sourceCode.object = (SourceCodeText *)0x0;
  result.range.end.location.data = (char *)0x0;
  this = &pos->location;
  UTF8Reader::findEndOfWhitespace((UTF8Reader *)&line);
  (pos->location).data = line._M_dataplus._M_p;
  CodeLocation::operator=(&result.range.start,pos);
  bVar4 = UTF8Reader::advanceIfStartsWith(this,"/*");
  if (!bVar4) {
    bVar4 = UTF8Reader::advanceIfStartsWith(this,"//");
    if (bVar4) {
      result.valid = true;
      result.isStarSlash = false;
      while (UVar5 = UTF8Reader::operator*(this), UVar5 == 0x2f) {
        result.isDoxygenStyle = true;
        UTF8Reader::operator++(this);
      }
      goto LAB_001ebe4f;
    }
LAB_001ec013:
    __return_storage_ptr__->valid = false;
    __return_storage_ptr__->isStarSlash = false;
    __return_storage_ptr__->isDoxygenStyle = false;
    __return_storage_ptr__->isReferringBackwards = false;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->range).start.sourceCode.object = (SourceCodeText *)0x0;
    (__return_storage_ptr__->range).start.location.data = (char *)0x0;
    (__return_storage_ptr__->range).end.sourceCode.object = (SourceCodeText *)0x0;
    (__return_storage_ptr__->range).end.location.data = (char *)0x0;
    goto LAB_001ec313;
  }
  result.valid = true;
  result.isStarSlash = true;
  while (UVar5 = UTF8Reader::operator*(this), UVar5 == 0x2a) {
    result.isDoxygenStyle = true;
    UTF8Reader::operator++(this);
  }
LAB_001ebe4f:
  bVar4 = UTF8Reader::advanceIfStartsWith(this,"<");
  if (bVar4) {
    result.isReferringBackwards = true;
  }
  while (UVar5 = UTF8Reader::operator*(this), UVar5 == 0x20) {
    UTF8Reader::operator++(this);
  }
  if (result.isStarSlash == false) {
    while( true ) {
      CodeLocation::getSourceLine_abi_cxx11_(&local_70,pos);
      choc::text::trim(&line,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      s._M_str = "//";
      s._M_len = 2;
      t._M_str = line._M_dataplus._M_p;
      t._M_len = line._M_string_length;
      bVar4 = choc::text::startsWith(t,s);
      if (!bVar4) break;
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)&line);
      while( true ) {
        std::__cxx11::string::operator=((string *)&line,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        if ((line._M_string_length == 0) || (*line._M_dataplus._M_p != '/')) break;
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)&line);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&result.lines,&line);
      CodeLocation::getStartOfNextLine((CodeLocation *)&local_b0);
      CodeLocation::operator=(pos,(CodeLocation *)&local_b0);
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                ((RefCountedPtr<soul::SourceCodeText> *)&local_b0);
      std::__cxx11::string::~string((string *)&line);
    }
    std::__cxx11::string::~string((string *)&line);
    CodeLocation::operator=(&result.range.end,pos);
    pbVar3 = result.lines.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (result.lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        result.lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar13 = (string *)0x3e8;
      for (pbVar6 = result.lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar6 != result.lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
        pos = (CodeLocation *)pbVar6->_M_string_length;
        for (psVar7 = (string *)0x0; (string *)pos != psVar7;
            psVar7 = (string *)((long)&(psVar7->_M_dataplus)._M_p + 1)) {
          if ((pbVar6->_M_dataplus)._M_p[(long)&(psVar7->_M_dataplus)._M_p] != ' ')
          goto LAB_001ec162;
        }
        psVar7 = (string *)0x0;
LAB_001ec162:
        if (psVar7 < psVar13) {
          psVar13 = psVar7;
        }
      }
      if (psVar13 != (string *)0x0) {
        for (pbVar6 = result.lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar3;
            pbVar6 = pbVar6 + 1) {
          std::__cxx11::string::substr((ulong)&line,(ulong)pbVar6);
          pos = (CodeLocation *)&line;
          std::__cxx11::string::operator=((string *)pbVar6,(string *)&line);
          std::__cxx11::string::~string((string *)&line);
        }
      }
    }
  }
  else {
    UTF8Reader::find(&closeComment,(char *)this);
    if (*closeComment.data == '\0') goto LAB_001ec013;
    line._M_dataplus._M_p = (pointer)&line.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&line,this->data);
    text._M_str = (char *)0x0;
    text._M_len = (size_t)line._M_dataplus._M_p;
    choc::text::splitIntoLines_abi_cxx11_(&local_b0,(text *)line._M_string_length,text,(bool)in_R8B)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&result.lines,&local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0);
    std::__cxx11::string::~string((string *)&line);
    pcVar1 = (pos->location).data;
    CodeLocation::getStartOfLine((CodeLocation *)&line);
    uVar8 = (long)pcVar1 - line._M_string_length;
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&line);
    pbVar3 = result.lines.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar6 = result.lines.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (pbVar6 == pbVar3) break;
      std::__cxx11::string::string((string *)&local_90,(string *)pbVar6);
      choc::text::trimEnd(&line,&local_90);
      std::__cxx11::string::operator=((string *)pbVar6,(string *)&line);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::string::~string((string *)&local_90);
      sVar2 = pbVar6->_M_string_length;
      std::__cxx11::string::string((string *)&local_50,(string *)pbVar6);
      choc::text::trimStart(&line,&local_50);
      uVar11 = sVar2 - line._M_string_length;
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::string::~string((string *)&local_50);
      if ((0 < (long)uVar8) && (uVar8 <= uVar11)) {
        std::__cxx11::string::substr((ulong)&line,(ulong)pbVar6);
        std::__cxx11::string::operator=((string *)pbVar6,(string *)&line);
        std::__cxx11::string::~string((string *)&line);
      }
      pbVar6 = pbVar6 + 1;
    }
    CodeLocation::operator=(&result.range.end,pos);
    result.range.end.location = closeComment;
    pos = (CodeLocation *)0x2;
    UTF8Reader::operator+=(&result.range.end.location,2);
  }
  pbVar3 = result.lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)result.lines.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)result.lines.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = result.lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar12 = lVar10 >> 7; cVar9._M_current = pbVar6, 0 < lVar12; lVar12 = lVar12 + -1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::operator()
                      ((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                        *)pbVar6,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )pos);
    if (bVar4) goto LAB_001ec284;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::operator()
                      ((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                        *)(pbVar6 + 1),
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )pos);
    cVar9._M_current = pbVar6 + 1;
    if (bVar4) goto LAB_001ec284;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::operator()
                      ((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                        *)(pbVar6 + 2),
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )pos);
    cVar9._M_current = pbVar6 + 2;
    if (bVar4) goto LAB_001ec284;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::operator()
                      ((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                        *)(pbVar6 + 3),
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )pos);
    cVar9._M_current = pbVar6 + 3;
    if (bVar4) goto LAB_001ec284;
    pbVar6 = pbVar6 + 4;
    lVar10 = lVar10 + -0x80;
  }
  lVar10 = lVar10 >> 5;
  if (lVar10 == 1) {
LAB_001ec338:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::operator()
                      ((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                        *)pbVar6,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )pos);
    cVar9._M_current = pbVar6;
    if (!bVar4) {
      cVar9._M_current = pbVar3;
    }
LAB_001ec284:
    this_00 = cVar9._M_current;
    if (cVar9._M_current != pbVar3) {
      while (this_00 = this_00 + 1, this_00 != pbVar3) {
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
                operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                            *)this_00,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )pos);
        if (!bVar4) {
          pos = (CodeLocation *)this_00;
          std::__cxx11::string::operator=((string *)cVar9._M_current,(string *)this_00);
          cVar9._M_current = cVar9._M_current + 1;
        }
      }
    }
    if (cVar9._M_current != pbVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&result.lines,cVar9,(const_iterator)pbVar3);
    }
  }
  else {
    if (lVar10 == 2) {
LAB_001ec26c:
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
              operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                          *)pbVar6,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )pos);
      cVar9._M_current = pbVar6;
      if (!bVar4) {
        pbVar6 = pbVar6 + 1;
        goto LAB_001ec338;
      }
      goto LAB_001ec284;
    }
    if (lVar10 == 3) {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
              operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                          *)pbVar6,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )pos);
      if (!bVar4) {
        pbVar6 = pbVar6 + 1;
        goto LAB_001ec26c;
      }
      goto LAB_001ec284;
    }
  }
  while ((result.lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          result.lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish &&
         (result.lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length == 0))) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&result.lines,
            result.lines.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1);
  }
  while ((result.lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          result.lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish &&
         ((result.lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0))) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&result.lines,
            (const_iterator)
            result.lines.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start);
  }
  Comment::Comment(__return_storage_ptr__,&result);
LAB_001ec313:
  Comment::~Comment(&result);
  return __return_storage_ptr__;
}

Assistant:

SourceCodeUtilities::Comment SourceCodeUtilities::parseComment (CodeLocation pos)
{
    if (pos.isEmpty())
        return {};

    Comment result;
    pos.location = pos.location.findEndOfWhitespace();
    result.range.start = pos;

    if (pos.location.advanceIfStartsWith ("/*"))
    {
        result.valid = true;
        result.isStarSlash = true;

        while (*pos.location == '*')
        {
            result.isDoxygenStyle = true;
            ++(pos.location);
        }
    }
    else if (pos.location.advanceIfStartsWith ("//"))
    {
        result.valid = true;
        result.isStarSlash = false;

        while (*pos.location == '/')
        {
            result.isDoxygenStyle = true;
            ++(pos.location);
        }
    }
    else
    {
        return {};
    }

    if (pos.location.advanceIfStartsWith ("<"))
        result.isReferringBackwards = true;

    while (*pos.location == ' ')
        ++(pos.location);

    if (result.isStarSlash)
    {
        auto closeComment = pos.location.find ("*/");

        if (closeComment.isEmpty())
            return {};

        result.lines = choc::text::splitIntoLines (std::string (pos.location.getAddress(),
                                                                closeComment.getAddress()),
                                                   false);

        auto firstLineIndent = pos.location.getAddress() - pos.getStartOfLine().location.getAddress();

        for (auto& l : result.lines)
        {
            l = choc::text::trimEnd (l);
            auto leadingSpacesOnLine = l.length() - choc::text::trimStart (l).length();

            if (firstLineIndent > 0 && leadingSpacesOnLine >= (size_t) firstLineIndent)
                l = l.substr ((size_t) firstLineIndent);
        }

        result.range.end = pos;
        result.range.end.location = closeComment;
        result.range.end.location += 2;
    }
    else
    {
        for (;;)
        {
            auto line = choc::text::trim (pos.getSourceLine());

            if (! choc::text::startsWith (line, "//"))
                break;

            line = line.substr (2);

            while (! line.empty() && line[0] == '/')
                line = line.substr (1);

            result.lines.push_back (line);
            pos = pos.getStartOfNextLine();
        }

        result.range.end = pos;

        if (! result.lines.empty())
        {
            auto countLeadingSpaces = [] (std::string_view s) -> size_t
            {
                for (size_t i = 0; i < s.length(); ++i)
                    if (s[i] != ' ')
                        return i;

                return 0;
            };

            size_t leastLeadingSpace = 1000;

            for (auto& l : result.lines)
                leastLeadingSpace = std::min (leastLeadingSpace, countLeadingSpaces (l));

            if (leastLeadingSpace != 0)
                for (auto& l : result.lines)
                    l = l.substr (leastLeadingSpace);
        }
    }

    removeIf (result.lines, [] (const std::string& s) { return choc::text::contains (s, "================")
                                                            || choc::text::contains (s, "****************"); });

    while (! result.lines.empty() && result.lines.back().empty())
        result.lines.erase (result.lines.end() - 1);

    while (! result.lines.empty() && result.lines.front().empty())
        result.lines.erase (result.lines.begin());

    return result;
}